

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O3

Global * __thiscall wasm::Module::getGlobal(Module *this,Name name)

{
  mapped_type pGVar1;
  mapped_type *ppGVar2;
  string *in_R8;
  Name name_00;
  long *local_50 [2];
  long local_40 [2];
  
  name_00.super_IString.str._M_len = name.super_IString.str._M_str;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"getGlobal","");
  name_00.super_IString.str._M_str = (char *)local_50;
  ppGVar2 = getModuleElement<std::unordered_map<wasm::Name,wasm::Global*,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Global*>>>>
                      ((wasm *)&this->globalsMap,name.super_IString.str._M_len,name_00,in_R8);
  pGVar1 = *ppGVar2;
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return pGVar1;
}

Assistant:

Global* Module::getGlobal(Name name) {
  return getModuleElement(globalsMap, name, "getGlobal");
}